

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O3

void hide_tractor_beams(Am_Object *ship_obj,bool become_visible)

{
  Am_Slot_Key AVar1;
  char cVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  ushort uVar5;
  ushort uVar6;
  Am_Object other_ship;
  Am_Object beam;
  Am_Value_List beams;
  Am_Value_List other_beams;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object *local_58;
  Am_Value_List local_50 [16];
  Am_Value_List local_40 [16];
  
  local_60.data = (Am_Object_Data *)0x0;
  local_68.data = (Am_Object_Data *)0x0;
  local_58 = ship_obj;
  Am_Value_List::Am_Value_List(local_50);
  Am_Value_List::Am_Value_List(local_40);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)local_58,(ulong)TB_LIST);
  Am_Value_List::operator=(local_50,pAVar3);
  Am_Value_List::Start();
  while( true ) {
    cVar2 = Am_Value_List::Last();
    if (cVar2 != '\0') break;
    pAVar3 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&local_60,pAVar3);
    uVar5 = (ushort)&local_60;
    pAVar3 = (Am_Value *)Am_Object::Get(uVar5,(ulong)TB_SOURCE);
    Am_Object::operator=(&local_68,pAVar3);
    cVar2 = Am_Object::operator==(&local_68,local_58);
    if (cVar2 != '\0') {
      pAVar3 = (Am_Value *)Am_Object::Get(uVar5,(ulong)TB_DEST);
      Am_Object::operator=(&local_68,pAVar3);
    }
    uVar6 = (ushort)&local_68;
    pAVar3 = (Am_Value *)Am_Object::Get(uVar6,(ulong)TB_LIST);
    Am_Value_List::operator=(local_40,pAVar3);
    if (become_visible) {
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_60);
      Am_Value_List::Add(local_40,pAVar4,1,1);
    }
    else {
      Am_Value_List::Start();
      Am_Object::operator_cast_to_Am_Wrapper_(&local_60);
      cVar2 = Am_Value_List::Member((Am_Wrapper *)local_40);
      if (cVar2 != '\0') {
        Am_Value_List::Delete(SUB81(local_40,0));
      }
    }
    Am_Object::Set(uVar5,true,(ulong)become_visible);
    AVar1 = TB_LIST;
    pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_40);
    Am_Object::Set(uVar6,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar4);
    Am_Value_List::Next();
  }
  Am_Value_List::~Am_Value_List(local_40);
  Am_Value_List::~Am_Value_List(local_50);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_60);
  return;
}

Assistant:

void
hide_tractor_beams(Am_Object ship_obj, bool become_visible)
{
  Am_Object beam, other_ship;
  Am_Value_List beams, other_beams;
  beams = ship_obj.Get(TB_LIST);
  for (beams.Start(); !beams.Last(); beams.Next()) {
    beam = beams.Get();

    // Remove tractor beam from the value list of its other attached ship
    other_ship = beam.Get(TB_SOURCE);
    if (other_ship == ship_obj)
      // Oops, ship_obj was the source, we meant to get TB_DEST
      other_ship = beam.Get(TB_DEST);
    other_beams = other_ship.Get(TB_LIST);
    if (become_visible) { // then add it to other ships
      other_beams.Add(beam);
    } else { // remove it from other ship's list
      other_beams.Start();
      if (other_beams.Member(beam)) //sets the pointer to beam
        other_beams.Delete();
    }
    beam.Set(Am_VISIBLE, become_visible);
    other_ship.Set(TB_LIST, other_beams);
  }
}